

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::DockNodePreviewDockRender
               (ImGuiWindow *host_window,ImGuiDockNode *host_node,ImGuiWindow *root_payload,
               ImGuiDockPreviewData *data)

{
  char *label;
  ImGuiWindow *payload;
  ImGuiContext *pIVar1;
  bool bVar2;
  ImU32 IVar3;
  float fVar4;
  float fVar5;
  ImU32 col;
  uint flags;
  ImDrawList *pIVar6;
  long lVar7;
  ImGuiWindow **ppIVar8;
  ImGuiTabItem *pIVar9;
  float fVar10;
  ImVec2 IVar11;
  float local_1a4;
  int local_194;
  ImGuiTabBar *local_190;
  bool local_171;
  float local_16c;
  float local_164;
  float local_15c;
  float local_154;
  ImVec2 local_150;
  ImVec2 local_148;
  ImVec2 local_140;
  ImVec2 local_138;
  ImVec2 local_130;
  ImVec2 local_128;
  ImVec2 center;
  int overlay_n_2;
  ImU32 overlay_col;
  ImRect draw_r_in;
  ImRect draw_r;
  int dir;
  float overlay_rounding;
  int local_d4;
  ImGuiTabItemFlags tab_flags;
  int overlay_n_1;
  ImU32 overlay_col_tabs;
  ImU32 overlay_col_text;
  ImRect tab_bb;
  ImVec2 tab_size;
  ImGuiWindow *payload_window;
  int payload_n;
  int payload_count;
  ImGuiTabBar *tab_bar_with_payload;
  float local_90;
  ImVec2 local_88;
  ImVec2 tab_pos;
  ImRect tab_bar_rect;
  int overlay_n;
  ImRect overlay_rect;
  bool can_preview_tabs;
  ImU32 overlay_col_lines;
  ImU32 overlay_col_drop_hovered;
  ImU32 overlay_col_drop;
  ImU32 overlay_col_main;
  ImDrawList *overlay_draw_lists [2];
  int overlay_draw_lists_count;
  bool is_transparent_payload;
  ImGuiContext *g;
  ImGuiDockPreviewData *data_local;
  ImGuiWindow *root_payload_local;
  ImGuiDockNode *host_node_local;
  ImGuiWindow *host_window_local;
  
  pIVar1 = GImGui;
  if (GImGui->CurrentWindow != host_window) {
    __assert_fail("g.CurrentWindow == host_window",
                  "/workspace/llm4binary/github/license_c_cmakelists/binji[P]binjgb/third_party/imgui/imgui.cpp"
                  ,0x39da,
                  "void ImGui::DockNodePreviewDockRender(ImGuiWindow *, ImGuiDockNode *, ImGuiWindow *, const ImGuiDockPreviewData *)"
                 );
  }
  overlay_draw_lists[1]._7_1_ = (GImGui->IO).ConfigDockingTransparentPayload & 1;
  overlay_draw_lists[1]._0_4_ = 0;
  pIVar6 = GetForegroundDrawList(&host_window->Viewport->super_ImGuiViewport);
  lVar7 = (long)(int)overlay_draw_lists[1];
  overlay_draw_lists[1]._0_4_ = (int)overlay_draw_lists[1] + 1;
  *(ImDrawList **)(&overlay_col_drop + lVar7 * 2) = pIVar6;
  if ((host_window->Viewport != root_payload->Viewport) && ((overlay_draw_lists[1]._7_1_ & 1) == 0))
  {
    pIVar6 = GetForegroundDrawList(&root_payload->Viewport->super_ImGuiViewport);
    lVar7 = (long)(int)overlay_draw_lists[1];
    overlay_draw_lists[1]._0_4_ = (int)overlay_draw_lists[1] + 1;
    *(ImDrawList **)(&overlay_col_drop + lVar7 * 2) = pIVar6;
  }
  local_154 = 0.6;
  if ((overlay_draw_lists[1]._7_1_ & 1) == 0) {
    local_154 = 0.4;
  }
  IVar3 = GetColorU32(0x26,local_154);
  local_15c = 0.9;
  if ((overlay_draw_lists[1]._7_1_ & 1) == 0) {
    local_15c = 0.7;
  }
  fVar4 = (float)GetColorU32(0x26,local_15c);
  local_164 = 1.2;
  if ((overlay_draw_lists[1]._7_1_ & 1) == 0) {
    local_164 = 1.0;
  }
  fVar5 = (float)GetColorU32(0x26,local_164);
  local_16c = 0.8;
  if ((overlay_draw_lists[1]._7_1_ & 1) == 0) {
    local_16c = 0.6;
  }
  overlay_rect.Max.y = (float)GetColorU32(0x34,local_16c);
  local_171 = true;
  if (root_payload->DockNodeAsHost != (ImGuiDockNode *)0x0) {
    local_171 = 0 < (root_payload->DockNodeAsHost->Windows).Size;
  }
  overlay_rect.Max.x._3_1_ = local_171;
  if ((data->IsDropAllowed & 1U) != 0) {
    join_0x00001240_0x00001200_ = ImGuiDockNode::Rect(&data->FutureNode);
    if ((data->SplitDir == -1) && ((overlay_rect.Max.x._3_1_ & 1) != 0)) {
      fVar10 = GetFrameHeight();
      overlay_n = (int)(fVar10 + (float)overlay_n);
    }
    if ((data->SplitDir != -1) || ((data->IsCenterAvailable & 1U) != 0)) {
      for (tab_bar_rect.Max.x = 0.0; (int)tab_bar_rect.Max.x < (int)overlay_draw_lists[1];
          tab_bar_rect.Max.x = (float)((int)tab_bar_rect.Max.x + 1)) {
        ImDrawList::AddRectFilled
                  (*(ImDrawList **)(&overlay_col_drop + (long)(int)tab_bar_rect.Max.x * 2),
                   (ImVec2 *)&tab_bar_rect.Max.y,&overlay_rect.Min,IVar3,host_window->WindowRounding
                   ,0);
      }
    }
  }
  if (((((data->IsDropAllowed & 1U) != 0) && ((overlay_rect.Max.x._3_1_ & 1) != 0)) &&
      (data->SplitDir == -1)) && ((data->IsCenterAvailable & 1U) != 0)) {
    ImRect::ImRect((ImRect *)&tab_pos);
    DockNodeCalcTabBarLayout
              (&data->FutureNode,(ImRect *)0x0,(ImRect *)&tab_pos,(ImVec2 *)0x0,(ImVec2 *)0x0);
    local_88 = tab_pos;
    IVar11 = local_88;
    local_88.x = tab_pos.x;
    local_88.y = tab_pos.y;
    if ((host_node == (ImGuiDockNode *)0x0) || (host_node->TabBar == (ImGuiTabBar *)0x0)) {
      if ((host_window->Flags & 0x20000000U) == 0) {
        fVar10 = (pIVar1->Style).ItemInnerSpacing.x;
        IVar11 = TabItemCalcSize(host_window->Name,(bool)(host_window->HasCloseButton & 1));
        tab_bar_with_payload._0_4_ = IVar11.x;
        local_88.x = fVar10 + tab_bar_with_payload._0_4_ + local_88.x;
        IVar11 = local_88;
      }
    }
    else {
      bVar2 = ImGuiDockNode::IsHiddenTabBar(host_node);
      if ((bVar2) || (bVar2 = ImGuiDockNode::IsNoTabBar(host_node), bVar2)) {
        fVar10 = (pIVar1->Style).ItemInnerSpacing.x;
        ppIVar8 = ImVector<ImGuiWindow_*>::operator[](&host_node->Windows,0);
        label = (*ppIVar8)->Name;
        ppIVar8 = ImVector<ImGuiWindow_*>::operator[](&host_node->Windows,0);
        IVar11 = TabItemCalcSize(label,(bool)((*ppIVar8)->HasCloseButton & 1));
        local_90 = IVar11.x;
        fVar10 = fVar10 + local_90;
      }
      else {
        fVar10 = host_node->TabBar->WidthAllTabs + (pIVar1->Style).ItemInnerSpacing.x;
      }
      local_88.x = fVar10 + local_88.x;
      IVar11 = local_88;
    }
    local_88 = IVar11;
    if ((root_payload->DockNodeAsHost != (ImGuiDockNode *)0x0) &&
       ((root_payload->DockNodeAsHost->TabBar->Tabs).Size <
        (root_payload->DockNodeAsHost->Windows).Size)) {
      __assert_fail("root_payload->DockNodeAsHost->Windows.Size <= root_payload->DockNodeAsHost->TabBar->Tabs.Size"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/binji[P]binjgb/third_party/imgui/imgui.cpp"
                    ,0x3a0e,
                    "void ImGui::DockNodePreviewDockRender(ImGuiWindow *, ImGuiDockNode *, ImGuiWindow *, const ImGuiDockPreviewData *)"
                   );
    }
    if (root_payload->DockNodeAsHost == (ImGuiDockNode *)0x0) {
      local_190 = (ImGuiTabBar *)0x0;
    }
    else {
      local_190 = root_payload->DockNodeAsHost->TabBar;
    }
    if (local_190 == (ImGuiTabBar *)0x0) {
      local_194 = 1;
    }
    else {
      local_194 = (local_190->Tabs).Size;
    }
    for (payload_window._0_4_ = 0; (int)payload_window < local_194;
        payload_window._0_4_ = (int)payload_window + 1) {
      payload = root_payload;
      if (local_190 == (ImGuiTabBar *)0x0) {
LAB_0015a366:
        bVar2 = DockNodeIsDropAllowedOne(payload,host_window);
        if (bVar2) {
          tab_bb.Max = TabItemCalcSize(payload->Name,(bool)(payload->HasCloseButton & 1));
          ImRect::ImRect((ImRect *)&overlay_col_tabs,local_88.x,local_88.y,local_88.x + tab_bb.Max.x
                         ,local_88.y + tab_bb.Max.y);
          local_88.x = tab_bb.Max.x + (pIVar1->Style).ItemInnerSpacing.x + local_88.x;
          IVar3 = GetColorU32((payload->DockStyle).Colors[0]);
          col = GetColorU32((payload->DockStyle).Colors[3]);
          PushStyleColor(0,IVar3);
          for (local_d4 = 0; local_d4 < (int)overlay_draw_lists[1]; local_d4 = local_d4 + 1) {
            flags = (payload->Flags & 0x100000U) != 0 | 0x800000;
            bVar2 = ImRect::Contains((ImRect *)&tab_pos,(ImRect *)&overlay_col_tabs);
            if (!bVar2) {
              ImDrawList::PushClipRect
                        (*(ImDrawList **)(&overlay_col_drop + (long)local_d4 * 2),tab_pos,
                         tab_bar_rect.Min,false);
            }
            TabItemBackground(*(ImDrawList **)(&overlay_col_drop + (long)local_d4 * 2),
                              (ImRect *)&overlay_col_tabs,flags,col);
            TabItemLabelAndCloseButton
                      (*(ImDrawList **)(&overlay_col_drop + (long)local_d4 * 2),
                       (ImRect *)&overlay_col_tabs,flags,(pIVar1->Style).FramePadding,payload->Name,
                       0,0,false,(bool *)0x0,(bool *)0x0);
            bVar2 = ImRect::Contains((ImRect *)&tab_pos,(ImRect *)&overlay_col_tabs);
            if (!bVar2) {
              ImDrawList::PopClipRect(*(ImDrawList **)(&overlay_col_drop + (long)local_d4 * 2));
            }
          }
          PopStyleColor(1);
        }
      }
      else {
        pIVar9 = ImVector<ImGuiTabItem>::operator[](&local_190->Tabs,(int)payload_window);
        payload = pIVar9->Window;
        if (pIVar9->Window != (ImGuiWindow *)0x0) goto LAB_0015a366;
      }
    }
  }
  draw_r.Max.y = ImMax<float>(3.0,(pIVar1->Style).FrameRounding);
  draw_r.Max.x = -NAN;
  while( true ) {
    if (3 < (int)draw_r.Max.x) {
      return;
    }
    bVar2 = ImRect::IsInverted(data->DropRectsDraw + ((int)draw_r.Max.x + 1));
    if (!bVar2) {
      _overlay_n_2 = data->DropRectsDraw[(int)draw_r.Max.x + 1].Min;
      draw_r_in.Min = (&data->DropRectsDraw[(int)draw_r.Max.x + 1].Min)[1];
      draw_r_in.Max = _overlay_n_2;
      draw_r.Min = draw_r_in.Min;
      ImRect::Expand((ImRect *)&overlay_n_2,-2.0);
      local_1a4 = fVar4;
      if (((float)data->SplitDir == draw_r.Max.x) && ((data->IsSplitDirExplicit & 1U) != 0)) {
        local_1a4 = fVar5;
      }
      center.y = local_1a4;
      for (center.x = 0.0; (int)center.x < (int)overlay_draw_lists[1];
          center.x = (float)((int)center.x + 1)) {
        local_130 = ImRect::GetCenter((ImRect *)&overlay_n_2);
        local_128 = ImFloor(&local_130);
        ImDrawList::AddRectFilled
                  (*(ImDrawList **)(&overlay_col_drop + (long)(int)center.x * 2),&draw_r_in.Max,
                   &draw_r.Min,(ImU32)center.y,draw_r.Max.y,0);
        ImDrawList::AddRect(*(ImDrawList **)(&overlay_col_drop + (long)(int)center.x * 2),
                            (ImVec2 *)&overlay_n_2,&draw_r_in.Min,(ImU32)overlay_rect.Max.y,
                            draw_r.Max.y,0,1.0);
        if ((draw_r.Max.x == 0.0) || (draw_r.Max.x == 1.4013e-45)) {
          pIVar6 = *(ImDrawList **)(&overlay_col_drop + (long)(int)center.x * 2);
          ImVec2::ImVec2(&local_138,local_128.x,(float)overlay_col);
          ImVec2::ImVec2(&local_140,local_128.x,draw_r_in.Min.y);
          ImDrawList::AddLine(pIVar6,&local_138,&local_140,(ImU32)overlay_rect.Max.y,1.0);
        }
        if ((draw_r.Max.x == 2.8026e-45) || (draw_r.Max.x == 4.2039e-45)) {
          pIVar6 = *(ImDrawList **)(&overlay_col_drop + (long)(int)center.x * 2);
          ImVec2::ImVec2(&local_148,(float)overlay_n_2,local_128.y);
          ImVec2::ImVec2(&local_150,draw_r_in.Min.x,local_128.y);
          ImDrawList::AddLine(pIVar6,&local_148,&local_150,(ImU32)overlay_rect.Max.y,1.0);
        }
      }
    }
    if ((host_node != (ImGuiDockNode *)0x0) && ((host_node->MergedFlags & 0x10U) != 0)) break;
    if (((pIVar1->IO).ConfigDockingNoSplit & 1U) != 0) {
      return;
    }
    draw_r.Max.x = (float)((int)draw_r.Max.x + 1);
  }
  return;
}

Assistant:

static void ImGui::DockNodePreviewDockRender(ImGuiWindow* host_window, ImGuiDockNode* host_node, ImGuiWindow* root_payload, const ImGuiDockPreviewData* data)
{
    ImGuiContext& g = *GImGui;
    IM_ASSERT(g.CurrentWindow == host_window);   // Because we rely on font size to calculate tab sizes

    // With this option, we only display the preview on the target viewport, and the payload viewport is made transparent.
    // To compensate for the single layer obstructed by the payload, we'll increase the alpha of the preview nodes.
    const bool is_transparent_payload = g.IO.ConfigDockingTransparentPayload;

    // In case the two windows involved are on different viewports, we will draw the overlay on each of them.
    int overlay_draw_lists_count = 0;
    ImDrawList* overlay_draw_lists[2];
    overlay_draw_lists[overlay_draw_lists_count++] = GetForegroundDrawList(host_window->Viewport);
    if (host_window->Viewport != root_payload->Viewport && !is_transparent_payload)
        overlay_draw_lists[overlay_draw_lists_count++] = GetForegroundDrawList(root_payload->Viewport);

    // Draw main preview rectangle
    const ImU32 overlay_col_main = GetColorU32(ImGuiCol_DockingPreview, is_transparent_payload ? 0.60f : 0.40f);
    const ImU32 overlay_col_drop = GetColorU32(ImGuiCol_DockingPreview, is_transparent_payload ? 0.90f : 0.70f);
    const ImU32 overlay_col_drop_hovered = GetColorU32(ImGuiCol_DockingPreview, is_transparent_payload ? 1.20f : 1.00f);
    const ImU32 overlay_col_lines = GetColorU32(ImGuiCol_NavWindowingHighlight, is_transparent_payload ? 0.80f : 0.60f);

    // Display area preview
    const bool can_preview_tabs = (root_payload->DockNodeAsHost == NULL || root_payload->DockNodeAsHost->Windows.Size > 0);
    if (data->IsDropAllowed)
    {
        ImRect overlay_rect = data->FutureNode.Rect();
        if (data->SplitDir == ImGuiDir_None && can_preview_tabs)
            overlay_rect.Min.y += GetFrameHeight();
        if (data->SplitDir != ImGuiDir_None || data->IsCenterAvailable)
            for (int overlay_n = 0; overlay_n < overlay_draw_lists_count; overlay_n++)
                overlay_draw_lists[overlay_n]->AddRectFilled(overlay_rect.Min, overlay_rect.Max, overlay_col_main, host_window->WindowRounding);
    }

    // Display tab shape/label preview unless we are splitting node (it generally makes the situation harder to read)
    if (data->IsDropAllowed && can_preview_tabs && data->SplitDir == ImGuiDir_None && data->IsCenterAvailable)
    {
        // Compute target tab bar geometry so we can locate our preview tabs
        ImRect tab_bar_rect;
        DockNodeCalcTabBarLayout(&data->FutureNode, NULL, &tab_bar_rect, NULL, NULL);
        ImVec2 tab_pos = tab_bar_rect.Min;
        if (host_node && host_node->TabBar)
        {
            if (!host_node->IsHiddenTabBar() && !host_node->IsNoTabBar())
                tab_pos.x += host_node->TabBar->WidthAllTabs + g.Style.ItemInnerSpacing.x; // We don't use OffsetNewTab because when using non-persistent-order tab bar it is incremented with each Tab submission.
            else
                tab_pos.x += g.Style.ItemInnerSpacing.x + TabItemCalcSize(host_node->Windows[0]->Name, host_node->Windows[0]->HasCloseButton).x;
        }
        else if (!(host_window->Flags & ImGuiWindowFlags_DockNodeHost))
        {
            tab_pos.x += g.Style.ItemInnerSpacing.x + TabItemCalcSize(host_window->Name, host_window->HasCloseButton).x; // Account for slight offset which will be added when changing from title bar to tab bar
        }

        // Draw tab shape/label preview (payload may be a loose window or a host window carrying multiple tabbed windows)
        if (root_payload->DockNodeAsHost)
            IM_ASSERT(root_payload->DockNodeAsHost->Windows.Size <= root_payload->DockNodeAsHost->TabBar->Tabs.Size);
        ImGuiTabBar* tab_bar_with_payload = root_payload->DockNodeAsHost ? root_payload->DockNodeAsHost->TabBar : NULL;
        const int payload_count = tab_bar_with_payload ? tab_bar_with_payload->Tabs.Size : 1;
        for (int payload_n = 0; payload_n < payload_count; payload_n++)
        {
            // DockNode's TabBar may have non-window Tabs manually appended by user
            ImGuiWindow* payload_window = tab_bar_with_payload ? tab_bar_with_payload->Tabs[payload_n].Window : root_payload;
            if (tab_bar_with_payload && payload_window == NULL)
                continue;
            if (!DockNodeIsDropAllowedOne(payload_window, host_window))
                continue;

            // Calculate the tab bounding box for each payload window
            ImVec2 tab_size = TabItemCalcSize(payload_window->Name, payload_window->HasCloseButton);
            ImRect tab_bb(tab_pos.x, tab_pos.y, tab_pos.x + tab_size.x, tab_pos.y + tab_size.y);
            tab_pos.x += tab_size.x + g.Style.ItemInnerSpacing.x;
            const ImU32 overlay_col_text = GetColorU32(payload_window->DockStyle.Colors[ImGuiWindowDockStyleCol_Text]);
            const ImU32 overlay_col_tabs = GetColorU32(payload_window->DockStyle.Colors[ImGuiWindowDockStyleCol_TabActive]);
            PushStyleColor(ImGuiCol_Text, overlay_col_text);
            for (int overlay_n = 0; overlay_n < overlay_draw_lists_count; overlay_n++)
            {
                ImGuiTabItemFlags tab_flags = ImGuiTabItemFlags_Preview | ((payload_window->Flags & ImGuiWindowFlags_UnsavedDocument) ? ImGuiTabItemFlags_UnsavedDocument : 0);
                if (!tab_bar_rect.Contains(tab_bb))
                    overlay_draw_lists[overlay_n]->PushClipRect(tab_bar_rect.Min, tab_bar_rect.Max);
                TabItemBackground(overlay_draw_lists[overlay_n], tab_bb, tab_flags, overlay_col_tabs);
                TabItemLabelAndCloseButton(overlay_draw_lists[overlay_n], tab_bb, tab_flags, g.Style.FramePadding, payload_window->Name, 0, 0, false, NULL, NULL);
                if (!tab_bar_rect.Contains(tab_bb))
                    overlay_draw_lists[overlay_n]->PopClipRect();
            }
            PopStyleColor();
        }
    }

    // Display drop boxes
    const float overlay_rounding = ImMax(3.0f, g.Style.FrameRounding);
    for (int dir = ImGuiDir_None; dir < ImGuiDir_COUNT; dir++)
    {
        if (!data->DropRectsDraw[dir + 1].IsInverted())
        {
            ImRect draw_r = data->DropRectsDraw[dir + 1];
            ImRect draw_r_in = draw_r;
            draw_r_in.Expand(-2.0f);
            ImU32 overlay_col = (data->SplitDir == (ImGuiDir)dir && data->IsSplitDirExplicit) ? overlay_col_drop_hovered : overlay_col_drop;
            for (int overlay_n = 0; overlay_n < overlay_draw_lists_count; overlay_n++)
            {
                ImVec2 center = ImFloor(draw_r_in.GetCenter());
                overlay_draw_lists[overlay_n]->AddRectFilled(draw_r.Min, draw_r.Max, overlay_col, overlay_rounding);
                overlay_draw_lists[overlay_n]->AddRect(draw_r_in.Min, draw_r_in.Max, overlay_col_lines, overlay_rounding);
                if (dir == ImGuiDir_Left || dir == ImGuiDir_Right)
                    overlay_draw_lists[overlay_n]->AddLine(ImVec2(center.x, draw_r_in.Min.y), ImVec2(center.x, draw_r_in.Max.y), overlay_col_lines);
                if (dir == ImGuiDir_Up || dir == ImGuiDir_Down)
                    overlay_draw_lists[overlay_n]->AddLine(ImVec2(draw_r_in.Min.x, center.y), ImVec2(draw_r_in.Max.x, center.y), overlay_col_lines);
            }
        }

        // Stop after ImGuiDir_None
        if ((host_node && (host_node->MergedFlags & ImGuiDockNodeFlags_NoSplit)) || g.IO.ConfigDockingNoSplit)
            return;
    }
}